

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O3

Table * __thiscall luna::State::GetMetatable(State *this,char *metatable_name)

{
  Table *this_00;
  Value VVar1;
  anon_union_8_9_8deb4486_for_Value_0 local_38;
  ValueT local_30;
  anon_union_8_9_8deb4486_for_Value_0 local_28;
  undefined4 local_20;
  
  local_20 = 4;
  local_28.str_ = GetString(this,metatable_name);
  this_00 = GetMetatables(this);
  VVar1 = Table::GetValue(this_00,(Value *)&local_28);
  local_30 = VVar1.type_;
  local_38 = VVar1.field_0;
  if (local_30 == ValueT_Nil) {
    local_30 = ValueT_Table;
    local_38.table_ =
         GC::NewTable((this->gc_)._M_t.
                      super___uniq_ptr_impl<luna::GC,_std::default_delete<luna::GC>_>._M_t.
                      super__Tuple_impl<0UL,_luna::GC_*,_std::default_delete<luna::GC>_>.
                      super__Head_base<0UL,_luna::GC_*,_false>._M_head_impl,GCGen0);
    Table::SetValue(this_00,(Value *)&local_28,(Value *)&local_38);
  }
  if (local_30 == ValueT_Table) {
    return (Table *)local_38.obj_;
  }
  __assert_fail("metatable.type_ == ValueT_Table",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/State.cpp",
                0xce,"Table *luna::State::GetMetatable(const char *)");
}

Assistant:

Table * State::GetMetatable(const char *metatable_name)
    {
        Value k;
        k.type_ = ValueT_String;
        k.str_ = GetString(metatable_name);

        auto metatables = GetMetatables();
        auto metatable = metatables->GetValue(k);

        // Create table when metatable not existed
        if (metatable.type_ == ValueT_Nil)
        {
            metatable.type_ = ValueT_Table;
            metatable.table_ = NewTable();
            metatables->SetValue(k, metatable);
        }

        assert(metatable.type_ == ValueT_Table);
        return metatable.table_;
    }